

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mipmaps_image *
rf_load_ktx_image(rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,
                 rf_allocator allocator)

{
  rf_int rVar1;
  anon_union_24_2_65aa1e12_for_rf_mipmaps_image_0 local_88;
  undefined8 local_70;
  undefined8 local_68;
  long local_60;
  undefined4 local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  void *local_38;
  void *dst;
  rf_int rStack_28;
  int dst_size;
  rf_int src_size_local;
  void *src_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  src_local = allocator.user_data;
  rStack_28 = src_size;
  src_size_local = (rf_int)src;
  memset(__return_storage_ptr__,0,0x20);
  if ((src_size_local != 0) && (0 < rStack_28)) {
    rVar1 = rf_get_ktx_image_size((void *)src_size_local,rStack_28);
    dst._4_4_ = (int)rVar1;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_48 = "rf_load_ktx_image";
    local_40 = 0x4667;
    local_68 = 0;
    local_60 = (long)dst._4_4_;
    local_58 = 0;
    local_38 = (void *)(*(code *)allocator_local.user_data)(&src_local,1);
    rf_load_ktx_image_to_buffer
              ((rf_mipmaps_image *)&local_88.image,(void *)src_size_local,rStack_28,local_38,
               (long)dst._4_4_);
    (__return_storage_ptr__->field_0).image.data = local_88.image.data;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_88._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_88._16_8_;
    *(undefined8 *)&__return_storage_ptr__->mipmaps = local_70;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_ktx_image(const void* src, rf_int src_size, rf_allocator allocator)
{
    rf_mipmaps_image result = {0};

    if (src && src_size > 0)
    {
        int dst_size = rf_get_ktx_image_size(src, src_size);
        void* dst    = RF_ALLOC(allocator, dst_size);

        result = rf_load_ktx_image_to_buffer(src, src_size, dst, dst_size);
    }

    return result;
}